

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O3

void __thiscall
Assimp::X3DExporter::Export_MetadataDouble
          (X3DExporter *this,aiString *pKey,double pValue,size_t pTabLevel)

{
  undefined1 *puVar1;
  _Node *p_Var2;
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> attr_list;
  allocator local_89;
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  local_88;
  undefined1 local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  double local_30;
  
  local_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_88;
  local_88._M_impl._M_node._M_size = 0;
  puVar1 = local_70 + 0x10;
  local_88._M_impl._M_node.super__List_node_base._M_prev =
       local_88._M_impl._M_node.super__List_node_base._M_next;
  local_70._0_8_ = puVar1;
  local_30 = pValue;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"name","");
  std::__cxx11::string::string((string *)(local_70 + 0x20),pKey->data,&local_89);
  p_Var2 = std::__cxx11::
           list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
           _M_create_node<Assimp::X3DExporter::SAttribute>
                     ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&local_88,(SAttribute *)local_70);
  std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
  local_88._M_impl._M_node._M_size = local_88._M_impl._M_node._M_size + 1;
  if (local_50._M_dataplus._M_p != local_70 + 0x30) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((undefined1 *)local_70._0_8_ != puVar1) {
    operator_delete((void *)local_70._0_8_);
  }
  local_70._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"value","");
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_70 + 0x20),
             vsnprintf,0x148,"%f",local_30);
  p_Var2 = std::__cxx11::
           list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
           _M_create_node<Assimp::X3DExporter::SAttribute>
                     ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&local_88,(SAttribute *)local_70);
  std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
  local_88._M_impl._M_node._M_size = local_88._M_impl._M_node._M_size + 1;
  if (local_50._M_dataplus._M_p != local_70 + 0x30) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((undefined1 *)local_70._0_8_ != puVar1) {
    operator_delete((void *)local_70._0_8_);
  }
  local_70._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"MetadataDouble","");
  NodeHelper_OpenNode(this,(string *)local_70,pTabLevel,true,
                      (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&local_88);
  if ((undefined1 *)local_70._0_8_ != puVar1) {
    operator_delete((void *)local_70._0_8_);
  }
  std::__cxx11::
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
  _M_clear(&local_88);
  return;
}

Assistant:

void X3DExporter::Export_MetadataDouble(const aiString& pKey, const double pValue, const size_t pTabLevel)
{
list<SAttribute> attr_list;

	attr_list.push_back({"name", pKey.C_Str()});
	attr_list.push_back({"value", to_string(pValue)});
	NodeHelper_OpenNode("MetadataDouble", pTabLevel, true, attr_list);
}